

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_sa_system.hpp
# Opt level: O1

void __thiscall
openjij::system::
SASystem<openjij::graph::BinaryPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
::SetRandomConfiguration
          (SASystem<openjij::graph::BinaryPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
           *this,SeedType seed)

{
  result_type_conflict1 rVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  uniform_int_distribution<short> dist;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  random_number_engine;
  param_type local_13ac;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a8;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (&this->sample_,(long)this->system_size_);
  local_13ac._M_a = 0;
  local_13ac._M_b = 1;
  local_13a8._M_x[0] = seed & 0xffffffff;
  lVar3 = 1;
  uVar2 = local_13a8._M_x[0];
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    local_13a8._M_x[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13a8._M_p = 0x270;
  if (0 < this->system_size_) {
    lVar3 = 0;
    do {
      rVar1 = std::uniform_int_distribution<short>::operator()
                        ((uniform_int_distribution<short> *)&local_13ac,&local_13a8,&local_13ac);
      (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3] = (char)rVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->system_size_);
  }
  return;
}

Assistant:

void SetRandomConfiguration(const SeedType seed) {
      sample_.resize(system_size_);
      std::uniform_int_distribution<short> dist(0, 1);
      RandType random_number_engine(seed);
      for (std::int32_t i = 0; i < system_size_; i++) {
         sample_[i] = dist(random_number_engine);
      }
   }